

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabel::setText(QLabel *this,QString *text)

{
  bool bVar1;
  byte bVar2;
  QLabelPrivate *this_00;
  ulong uVar3;
  QLabelPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *oldControl;
  QLabelPrivate *d;
  QAccessibleEvent event;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QWidget *in_stack_ffffffffffffff80;
  QAnyStringView *this_01;
  QLabelPrivate *in_stack_ffffffffffffffb0;
  QAnyStringView *local_38;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLabel *)0x5ad825);
  bVar1 = ::operator==((QString *)in_stack_ffffffffffffff80,
                       (QString *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (!bVar1) {
    this_01 = (QAnyStringView *)this_00->control;
    this_00->control = (QWidgetTextControl *)0x0;
    QLabelPrivate::clearContents(in_stack_ffffffffffffffb0);
    QString::operator=(&this_00->text,(QString *)in_RSI);
    *(ushort *)&this_00->field_0x340 = *(ushort *)&this_00->field_0x340 & 0xffef | 0x10;
    *(ushort *)&this_00->field_0x340 = *(ushort *)&this_00->field_0x340 & 0xfff7 | 8;
    if (this_00->textformat == AutoText) {
      QAnyStringView::QAnyStringView(this_01,(QString *)in_RDI);
      uVar3 = Qt::mightBeRichText(local_38);
      if ((uVar3 & 1) == 0) {
        this_00->effectiveTextFormat = PlainText;
      }
      else {
        this_00->effectiveTextFormat = RichText;
      }
    }
    else {
      this_00->effectiveTextFormat = this_00->textformat;
    }
    this_00->control = (QWidgetTextControl *)this_01;
    bVar1 = QLabelPrivate::needTextControl(in_RSI);
    if (bVar1) {
      QLabelPrivate::ensureTextControl((QLabelPrivate *)oldControl);
    }
    else {
      in_stack_ffffffffffffff80 = (QWidget *)this_00->control;
      if (in_stack_ffffffffffffff80 != (QWidget *)0x0) {
        (**(code **)(*(long *)in_stack_ffffffffffffff80 + 0x20))();
      }
      this_00->control = (QWidgetTextControl *)0x0;
    }
    if (this_00->effectiveTextFormat != PlainText) {
      QWidget::setMouseTracking(in_stack_ffffffffffffff80,(bool)in_stack_ffffffffffffff7f);
    }
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x5ad9c4);
    if (bVar1) {
      QLabelPrivate::updateShortcut(this_00);
    }
    QLabelPrivate::updateLabel(this_00);
    QWidget::accessibleName(in_RDI);
    bVar2 = QString::isEmpty((QString *)0x5ad9f7);
    QString::~QString((QString *)0x5ada05);
    if ((bVar2 & 1) != 0) {
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleEvent::QAccessibleEvent
                ((QAccessibleEvent *)&local_28,&in_RDI->super_QObject,NameChanged);
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::setText(const QString &text)
{
    Q_D(QLabel);
    if (d->text == text)
        return;

    QWidgetTextControl *oldControl = d->control;
    d->control = nullptr;

    d->clearContents();
    d->text = text;
    d->isTextLabel = true;
    d->textDirty = true;
    if (d->textformat == Qt::AutoText) {
        if (Qt::mightBeRichText(d->text))
            d->effectiveTextFormat = Qt::RichText;
        else
            d->effectiveTextFormat = Qt::PlainText;
    } else {
        d->effectiveTextFormat = d->textformat;
    }

    d->control = oldControl;

    if (d->needTextControl()) {
        d->ensureTextControl();
    } else {
        delete d->control;
        d->control = nullptr;
    }

    if (d->effectiveTextFormat != Qt::PlainText) {
        setMouseTracking(true);
    } else {
        // Note: mouse tracking not disabled intentionally
    }

#ifndef QT_NO_SHORTCUT
    if (d->buddy)
        d->updateShortcut();
#endif

    d->updateLabel();

#if QT_CONFIG(accessibility)
    if (accessibleName().isEmpty()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}